

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O1

int Acb_ObjRemoveDupFanins_int(Acb_Ntk_t *p,int iObj)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (iObj < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (iObj < (p->vObjFans).nSize) {
    iVar2 = (p->vObjFans).pArray[(uint)iObj];
    lVar6 = (long)iVar2;
    if ((-1 < lVar6) && (iVar2 < (p->vFanSto).nSize)) {
      piVar3 = (p->vFanSto).pArray;
      lVar5 = (long)piVar3[lVar6];
      if (0 < lVar5) {
        lVar7 = 0;
        do {
          lVar8 = lVar7 + 1;
          lVar9 = lVar7;
          while (lVar5 + -1 != lVar9) {
            lVar1 = lVar9 + 1;
            lVar4 = lVar9 + 2;
            lVar9 = lVar1;
            if (piVar3[lVar6 + lVar8] == piVar3[lVar6 + lVar4]) {
              Acb_ObjRemoveDup(p,iObj,(int)lVar7,(int)lVar1);
              return 1;
            }
          }
          lVar7 = lVar8;
        } while (lVar8 != lVar5);
      }
      return 0;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Acb_ObjRemoveDupFanins_int( Acb_Ntk_t * p, int iObj )
{
    int i, k, * pFanins = Acb_ObjFanins( p, iObj );
    for ( i = 0; i < pFanins[0]; i++ )
    for ( k = i+1; k < pFanins[0]; k++ )
    {
        if ( pFanins[1+i] != pFanins[1+k] )
            continue;
        Acb_ObjRemoveDup( p, iObj, i, k );
        return 1;
    }
    return 0;
}